

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::printSummaryRow
          (ConsoleReporter *this,string *label,
          vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
          *cols,size_t row)

{
  bool bVar1;
  ostream *poVar2;
  pointer pSVar3;
  Colour local_59;
  string *local_58;
  string value;
  
  pSVar3 = (cols->
           super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = label;
  do {
    if (pSVar3 == (cols->
                  super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      std::operator<<((this->super_StreamingReporterBase).stream,"\n");
      return;
    }
    std::__cxx11::string::string
              ((string *)&value,
               (string *)
               ((pSVar3->rows).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + row));
    if ((pSVar3->label)._M_string_length == 0) {
      poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,(string *)local_58);
      std::operator<<(poVar2,": ");
      bVar1 = std::operator!=(&value,"0");
      poVar2 = (this->super_StreamingReporterBase).stream;
      if (!bVar1) {
        local_59.m_moved = false;
        Colour::use(ReconstructedExpression);
        std::operator<<(poVar2,"- none -");
        goto LAB_0014e0ab;
      }
      std::operator<<(poVar2,(string *)&value);
    }
    else {
      bVar1 = std::operator!=(&value,"0");
      if (bVar1) {
        poVar2 = (this->super_StreamingReporterBase).stream;
        local_59.m_moved = false;
        Colour::use(FileName);
        std::operator<<(poVar2," | ");
        Colour::~Colour(&local_59);
        poVar2 = (this->super_StreamingReporterBase).stream;
        local_59.m_moved = false;
        Colour::use(pSVar3->colour);
        poVar2 = std::operator<<(poVar2,(string *)&value);
        poVar2 = std::operator<<(poVar2," ");
        std::operator<<(poVar2,(string *)pSVar3);
LAB_0014e0ab:
        Colour::~Colour(&local_59);
      }
    }
    std::__cxx11::string::~string((string *)&value);
    pSVar3 = pSVar3 + 1;
  } while( true );
}

Assistant:

void printSummaryRow( std::string const& label, std::vector<SummaryColumn> const& cols, std::size_t row ) {
            for( std::vector<SummaryColumn>::const_iterator it = cols.begin(); it != cols.end(); ++it ) {
                std::string value = it->rows[row];
                if( it->label.empty() ) {
                    stream << label << ": ";
                    if( value != "0" )
                        stream << value;
                    else
                        stream << Colour( Colour::Warning ) << "- none -";
                }
                else if( value != "0" ) {
                    stream  << Colour( Colour::LightGrey ) << " | ";
                    stream  << Colour( it->colour )
                            << value << " " << it->label;
                }
            }
            stream << "\n";
        }